

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::CopyFaceIndicesLWO2
          (LWOImporter *this,iterator *it,uint16_t **cursor,uint16_t *end)

{
  byte bVar1;
  ushort uVar2;
  Face *pFVar3;
  ushort *puVar4;
  uint16_t *puVar5;
  uint16_t uVar6;
  ushort uVar7;
  uint *puVar8;
  Logger *this_00;
  runtime_error *this_01;
  uint uVar9;
  uint16_t *puVar10;
  long lVar11;
  ulong uVar12;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar10 = *cursor;
  while( true ) {
    if (end <= puVar10) {
      return;
    }
    pFVar3 = it->_M_current;
    it->_M_current = pFVar3 + 1;
    puVar4 = *cursor;
    *cursor = puVar4 + 1;
    uVar2 = *puVar4;
    uVar7 = (uVar2 & 0xff03) << 8 | uVar2 >> 8;
    (pFVar3->super_aiFace).mNumIndices = (uint)uVar7;
    if ((uVar2 & 0xff03) == 0) break;
    puVar8 = (uint *)operator_new__((ulong)uVar7 << 2);
    (pFVar3->super_aiFace).mIndices = puVar8;
    if ((pFVar3->super_aiFace).mNumIndices != 0) {
      uVar12 = 0;
      do {
        puVar5 = *cursor;
        uVar6 = *puVar5;
        puVar10 = (uint16_t *)((long)puVar5 + 1);
        *cursor = puVar10;
        if ((byte)uVar6 == 0xff) {
          bVar1 = *(byte *)((long)puVar5 + 1);
          *cursor = puVar5 + 1;
          uVar6 = puVar5[1];
          puVar10 = (uint16_t *)((long)puVar5 + 3);
          *cursor = puVar10;
          uVar9 = (uint)(byte)uVar6 << 8 | (uint)bVar1 << 0x10;
          lVar11 = 4;
        }
        else {
          uVar9 = (uint)(byte)uVar6 << 8;
          lVar11 = 2;
        }
        uVar6 = *puVar10;
        *cursor = (uint16_t *)((long)puVar5 + lVar11);
        (pFVar3->super_aiFace).mIndices[uVar12] =
             ((byte)uVar6 | uVar9) + this->mCurLayer->mPointIDXOfs;
        if ((ulong)(((long)(this->mCurLayer->mTempPoints).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mCurLayer->mTempPoints).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            (ulong)(pFVar3->super_aiFace).mIndices[uVar12]) {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"LWO2: Failure evaluating face record, index is out of range");
          (pFVar3->super_aiFace).mIndices[uVar12] =
               (int)((ulong)((long)(this->mCurLayer->mTempPoints).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mCurLayer->mTempPoints).
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 - 1
          ;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (pFVar3->super_aiFace).mNumIndices);
    }
    puVar10 = *cursor;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"LWO2: Encountered invalid face record with zero indices","");
  std::runtime_error::runtime_error(this_01,(string *)local_50);
  *(undefined ***)this_01 = &PTR__runtime_error_007fd498;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::CopyFaceIndicesLWO2(FaceList::iterator& it,
    uint16_t*& cursor,
    const uint16_t* const end)
{
    while (cursor < end)
    {
        LWO::Face& face = *it++;
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        face.mNumIndices = numIndices & 0x03FF;

        if(face.mNumIndices) /* byte swapping has already been done */
        {
            face.mIndices = new unsigned int[face.mNumIndices];
            for(unsigned int i = 0; i < face.mNumIndices; i++)
            {
                face.mIndices[i] = ReadVSizedIntLWO2((uint8_t*&)cursor) + mCurLayer->mPointIDXOfs;
                if(face.mIndices[i] > mCurLayer->mTempPoints.size())
                {
                    ASSIMP_LOG_WARN("LWO2: Failure evaluating face record, index is out of range");
                    face.mIndices[i] = (unsigned int)mCurLayer->mTempPoints.size()-1;
                }
            }
        }
        else throw DeadlyImportError("LWO2: Encountered invalid face record with zero indices");
    }
}